

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

BuiltinVariable * builtinObject(BuiltinVariable *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  BuiltinType *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  undefined1 auVar5 [16];
  QJsonArray dimArr;
  undefined1 *local_68;
  QJsonValueRef local_60 [16];
  QJsonValue local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)v);
  QVar4 = builtinTypeStr(*in_RSI);
  QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar4.m_size);
  nameKey();
  local_60 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)v);
  QJsonValueRef::operator=(local_60,local_50);
  QJsonValue::~QJsonValue(local_50);
  QVar4 = typeStr(in_RSI[1]);
  QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar4.m_size);
  typeKey();
  auVar5 = QJsonObject::operator[]((QLatin1String *)v);
  local_60 = (QJsonValueRef  [16])auVar5;
  QJsonValueRef::operator=(local_60,local_50);
  QJsonValue::~QJsonValue(local_50);
  if (*(undefined8 *)(in_RSI + 6) != PositionBuiltin) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_68);
    uVar1 = *(undefined8 *)(in_RSI + 4);
    uVar2 = *(undefined8 *)(in_RSI + 6);
    for (lVar3 = 0; uVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
      QJsonValue::QJsonValue(local_50,*(int *)(uVar1 + lVar3));
      QJsonArray::append((QJsonValue *)&local_68);
      QJsonValue::~QJsonValue(local_50);
    }
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_68);
    arrayDimsKey();
    auVar5 = QJsonObject::operator[]((QLatin1String *)v);
    local_60 = (QJsonValueRef  [16])auVar5;
    QJsonValueRef::operator=(local_60,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray((QJsonArray *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return v;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject builtinObject(const QShaderDescription::BuiltinVariable &v)
{
    QJsonObject obj;

    obj[nameKey()] = builtinTypeStr(v.type);
    obj[typeKey()] = typeStr(v.varType);
    if (!v.arrayDims.isEmpty()) {
        QJsonArray dimArr;
        for (int dim : v.arrayDims)
            dimArr.append(dim);
        obj[arrayDimsKey()] = dimArr;
    }
    return obj;
}